

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O3

void rprog_elven_down_end(CHAR_DATA *ch,AFFECT_DATA *af)

{
  ROOM_INDEX_DATA *pRoomIndex;
  
  pRoomIndex = get_room_index(0);
  char_from_room(ch);
  char_to_room(ch,pRoomIndex);
  act("You feel the floor drop beneath you, and you feel yourself fall and then impact as you hit the ground."
      ,ch,(void *)0x0,(void *)0x0,3);
  act("$n appears out of thin air, crumpling in to the ground with a thud.",ch,(void *)0x0,
      (void *)0x0,0);
  return;
}

Assistant:

void rprog_elven_down_end(CHAR_DATA *ch, AFFECT_DATA *af)
{
	ROOM_INDEX_DATA *to_room = nullptr;

	to_room = get_room_index(4704);

	char_from_room(ch);
	char_to_room(ch, to_room);

	act("You feel the floor drop beneath you, and you feel yourself fall and then impact as you hit the ground.", ch, 0, 0, TO_CHAR);
	act("$n appears out of thin air, crumpling in to the ground with a thud.", ch, 0, 0, TO_ROOM);
}